

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# star_expression.cpp
# Opt level: O3

case_insensitive_set_t * __thiscall
duckdb::StarExpression::SerializedExcludeList_abi_cxx11_
          (case_insensitive_set_t *__return_storage_ptr__,StarExpression *this)

{
  bool bVar1;
  __hashtable *__h;
  _Hash_node_base *p_Var2;
  case_insensitive_set_t *local_20;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  p_Var2 = (this->exclude_list)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      bVar1 = QualifiedColumnName::IsQualified((QualifiedColumnName *)(p_Var2 + 1));
      if (!bVar1) {
        local_20 = __return_storage_ptr__;
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)__return_storage_ptr__,p_Var2 + 0xd,&local_20);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

case_insensitive_set_t StarExpression::SerializedExcludeList() const {
	// we serialize non-qualified elements in a separate list of only column names for backwards compatibility
	case_insensitive_set_t result;
	for (auto &entry : exclude_list) {
		if (!entry.IsQualified()) {
			result.insert(entry.column);
		}
	}
	return result;
}